

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1d_cbs.c
# Opt level: O1

void mpp_av1_flush(AV1Context *ctx)

{
  memset(ctx->ref_s,0,0x7e0);
  ctx->operating_point_idc = 0;
  ctx->seen_frame_header = 0;
  ctx->tile_num = 0;
  return;
}

Assistant:

void mpp_av1_flush(AV1Context *ctx)
{
    //  ctx->sequencframe_headere_header = NULL;
    //  ctx-> = NULL;

    memset(ctx->ref_s, 0, sizeof(ctx->ref_s));
    ctx->operating_point_idc = 0;
    ctx->seen_frame_header = 0;
    ctx->tile_num = 0;
}